

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O3

void __thiscall icu_63::RBBIRuleScanner::fixOpStack(RBBIRuleScanner *this,OpPrecedence p)

{
  RBBINode *pRVar1;
  UErrorCode *pUVar2;
  UParseError *pUVar3;
  int32_t iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  RBBINode **ppRVar8;
  RBBINode *this_00;
  undefined4 in_register_00000034;
  RBBIRuleBuilder *pRVar9;
  OpPrecedence OVar10;
  OpPrecedence OVar11;
  
  pRVar9 = (RBBIRuleBuilder *)CONCAT44(in_register_00000034,p);
  OVar10 = precOpOr;
  if (3 < (int)p) {
    OVar10 = p;
  }
  lVar5 = (long)this->fNodeStackPtr;
  this_00 = this->fNodeStack[lVar5 + -1];
  OVar11 = this_00->fPrecedence;
  if (OVar11 != precZero) {
    uVar7 = lVar5 - 1;
    ppRVar8 = this->fNodeStack + lVar5;
    lVar5 = lVar5 << 0x20;
    do {
      iVar6 = (int)uVar7;
      if ((int)OVar11 < (int)OVar10) {
        if (2 < (int)p) {
          return;
        }
        if (OVar11 != p) {
          pRVar9 = this->fRB;
          if (*pRVar9->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
            *pRVar9->fStatus = U_BRK_MISMATCHED_PAREN;
            pRVar9 = (RBBIRuleBuilder *)pRVar9->fParseError;
            if (pRVar9 != (RBBIRuleBuilder *)0x0) {
              pRVar9->_vptr_RBBIRuleBuilder = *(_func_int ***)&this->fLineNum;
              *(undefined2 *)&pRVar9->fDebugEnv = 0;
              *(undefined2 *)&(pRVar9->fStrippedRules).super_Replaceable.super_UObject._vptr_UObject
                   = 0;
            }
          }
        }
        ppRVar8[-1] = (RBBINode *)*(long *)((long)this->fNodeStack + (lVar5 >> 0x1d));
        this->fNodeStackPtr = iVar6;
        RBBINode::~RBBINode(this_00);
        UMemory::operator_delete((UMemory *)this_00,pRVar9);
        return;
      }
      pRVar1 = *ppRVar8;
      this_00->fRightChild = pRVar1;
      pRVar1->fParent = this_00;
      this->fNodeStackPtr = iVar6;
      this_00 = ppRVar8[-2];
      OVar11 = this_00->fPrecedence;
      lVar5 = lVar5 + -0x100000000;
      ppRVar8 = ppRVar8 + -1;
      uVar7 = (ulong)(iVar6 - 1);
    } while (OVar11 != precZero);
  }
  pRVar9 = this->fRB;
  pUVar2 = pRVar9->fStatus;
  if (*pUVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
    *pUVar2 = U_BRK_ERROR_START;
    pUVar3 = pRVar9->fParseError;
    if (pUVar3 != (UParseError *)0x0) {
      iVar4 = this->fCharNum;
      pUVar3->line = this->fLineNum;
      pUVar3->offset = iVar4;
      pUVar3->preContext[0] = L'\0';
      pUVar3->postContext[0] = L'\0';
    }
  }
  return;
}

Assistant:

void RBBIRuleScanner::fixOpStack(RBBINode::OpPrecedence p) {
    RBBINode *n;
    // printNodeStack("entering fixOpStack()");
    for (;;) {
        n = fNodeStack[fNodeStackPtr-1];   // an operator node
        if (n->fPrecedence == 0) {
            RBBIDebugPuts("RBBIRuleScanner::fixOpStack, bad operator node");
            error(U_BRK_INTERNAL_ERROR);
            return;
        }

        if (n->fPrecedence < p || n->fPrecedence <= RBBINode::precLParen) {
            // The most recent operand goes with the current operator,
            //   not with the previously stacked one.
            break;
        }
            // Stack operator is a binary op  ( '|' or concatenation)
            //   TOS operand becomes right child of this operator.
            //   Resulting subexpression becomes the TOS operand.
            n->fRightChild = fNodeStack[fNodeStackPtr];
            fNodeStack[fNodeStackPtr]->fParent = n;
            fNodeStackPtr--;
        // printNodeStack("looping in fixOpStack()   ");
    }

    if (p <= RBBINode::precLParen) {
        // Scan is at a right paren or end of expression.
        //  The scanned item must match the stack, or else there was an error.
        //  Discard the left paren (or start expr) node from the stack,
            //  leaving the completed (sub)expression as TOS.
            if (n->fPrecedence != p) {
                // Right paren encountered matched start of expression node, or
                // end of expression matched with a left paren node.
                error(U_BRK_MISMATCHED_PAREN);
            }
            fNodeStack[fNodeStackPtr-1] = fNodeStack[fNodeStackPtr];
            fNodeStackPtr--;
            // Delete the now-discarded LParen or Start node.
            delete n;
    }
    // printNodeStack("leaving fixOpStack()");
}